

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::initSlice(HEkkDual *this,HighsInt initial_num_slice)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  HighsInt in_ESI;
  HEkkDualRow *in_RDI;
  HighsSparseMatrix *unaff_retaddr;
  HighsInt k;
  HighsInt from_el;
  HighsInt slice_num_col;
  HighsInt to_col;
  HighsInt from_col;
  HighsInt i_1;
  vector<int,_std::allocator<int>_> sliced_Astart;
  HighsInt stopX;
  HighsInt endX;
  HighsInt endColumn;
  HighsInt i;
  double sliced_countX;
  HighsInt AcountX;
  HighsInt *Astart;
  int in_stack_ffffffffffffff7c;
  int local_78;
  HighsInt in_stack_ffffffffffffff8c;
  HVectorBase<double> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  int local_54;
  vector<int,_std::allocator<int>_> local_50;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  double local_28;
  int local_1c;
  int *local_18;
  HighsInt in_stack_fffffffffffffff0;
  HEkkDualRow *matrix;
  
  *(HighsInt *)((long)&in_RDI[6].workMove + 4) = in_ESI;
  if (*(int *)((long)&in_RDI[6].workMove + 4) < 1) {
    *(undefined4 *)((long)&in_RDI[6].workMove + 4) = 1;
  }
  matrix = in_RDI;
  if (8 < *(int *)((long)&in_RDI[6].workMove + 4)) {
    highsLogDev((HighsLogOptions *)(*(long *)(in_RDI->workNumTotPermutation + 2) + 0x380),kWarning,
                "WARNING: %d = slice_num > kHighsSlicedLimit = %d so truncating slice_num\n",
                (ulong)*(uint *)((long)&in_RDI[6].workMove + 4),8);
    *(undefined4 *)((long)&in_RDI[6].workMove + 4) = 8;
  }
  local_18 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x786e34);
  local_1c = local_18[*(int *)((long)&in_RDI->workMove + 4)];
  local_28 = (double)local_1c / (double)*(int *)((long)&in_RDI[6].workMove + 4);
  *(undefined4 *)((long)&in_RDI[6].workDual + 4) = 0;
  local_2c = 0;
  do {
    if (*(int *)((long)&in_RDI[6].workMove + 4) + -1 <= local_2c) {
LAB_00786f42:
      *(undefined4 *)
       ((long)&in_RDI[6].workDual + (long)*(int *)((long)&in_RDI[6].workMove + 4) * 4 + 4) =
           *(undefined4 *)((long)&in_RDI->workMove + 4);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x786f62);
      for (local_54 = 0; local_54 < *(int *)((long)&in_RDI[6].workMove + 4); local_54 = local_54 + 1
          ) {
        iVar1 = *(int *)((long)&in_RDI[6].workDual + (long)local_54 * 4 + 4);
        iVar2 = *(int *)((long)&in_RDI[6].workRange + (long)local_54 * 4) - iVar1;
        iVar4 = local_18[iVar1];
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(*(int *)((long)&in_RDI[6].workRange + (long)local_54 * 4) + -1,iVar2),
                   CONCAT44(iVar4,in_stack_ffffffffffffff98));
        for (local_78 = 0; local_78 <= iVar2; local_78 = local_78 + 1) {
          in_stack_ffffffffffffff7c = local_18[local_78 + iVar1] - iVar4;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_78);
          *pvVar3 = in_stack_ffffffffffffff7c;
        }
        HighsSparseMatrix::createSlice
                  (unaff_retaddr,(HighsSparseMatrix *)matrix,in_ESI,in_stack_fffffffffffffff0);
        HighsSparseMatrix::createRowwise(_from_col,_slice_num_col);
        HVectorBase<double>::setup(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::operator[]
                  ((vector<HEkkDualRow,_std::allocator<HEkkDualRow>_> *)&in_RDI[0xf].alt_workCount,
                   (long)local_54);
        HEkkDualRow::setupSlice(in_RDI,in_stack_ffffffffffffff7c);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90);
      return;
    }
    local_30 = *(int *)((long)&in_RDI[6].workDual + (long)local_2c * 4 + 4) + 1;
    local_38 = (int)((double)(local_2c + 1) * local_28);
    local_34 = local_18[local_30];
    while (local_34 < local_38) {
      local_30 = local_30 + 1;
      local_34 = local_18[local_30];
    }
    *(int *)((long)&in_RDI[6].workDual + (long)(local_2c + 1) * 4 + 4) = local_30;
    if (*(int *)((long)&in_RDI->workMove + 4) <= local_30) {
      *(int *)((long)&in_RDI[6].workMove + 4) = local_2c;
      goto LAB_00786f42;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void HEkkDual::initSlice(const HighsInt initial_num_slice) {
  // Number of slices
  slice_num = initial_num_slice;
  if (slice_num < 1) slice_num = 1;
  assert(slice_num <= kHighsSlicedLimit);
  if (slice_num > kHighsSlicedLimit) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                "WARNING: %" HIGHSINT_FORMAT
                " = slice_num > kHighsSlicedLimit = %" HIGHSINT_FORMAT
                " so truncating "
                "slice_num\n",
                slice_num, kHighsSlicedLimit);
    slice_num = kHighsSlicedLimit;
  }

  // Alias to the matrix
  const HighsInt* Astart = a_matrix->start_.data();
  const HighsInt AcountX = Astart[solver_num_col];

  // Figure out partition weight
  double sliced_countX = AcountX / (double)slice_num;
  slice_start[0] = 0;
  for (HighsInt i = 0; i < slice_num - 1; i++) {
    HighsInt endColumn = slice_start[i] + 1;  // At least one column
    HighsInt endX = Astart[endColumn];
    HighsInt stopX = (i + 1) * sliced_countX;
    while (endX < stopX) {
      endX = Astart[++endColumn];
    }
    slice_start[i + 1] = endColumn;
    if (endColumn >= solver_num_col) {
      slice_num = i;  // SHRINK
      break;
    }
  }
  slice_start[slice_num] = solver_num_col;

  // Partition the matrix, row_ap and related packet
  vector<HighsInt> sliced_Astart;
  for (HighsInt i = 0; i < slice_num; i++) {
    // The matrix
    HighsInt from_col = slice_start[i];
    HighsInt to_col = slice_start[i + 1] - 1;
    HighsInt slice_num_col = slice_start[i + 1] - from_col;
    HighsInt from_el = Astart[from_col];
    sliced_Astart.resize(slice_num_col + 1);
    for (HighsInt k = 0; k <= slice_num_col; k++)
      sliced_Astart[k] = Astart[k + from_col] - from_el;
    slice_a_matrix[i].createSlice(ekk_instance_.lp_.a_matrix_, from_col,
                                  to_col);
    slice_ar_matrix[i].createRowwise(slice_a_matrix[i]);

    // The row_ap and its packages
    slice_row_ap[i].setup(slice_num_col);
    slice_dualRow[i].setupSlice(slice_num_col);
  }
}